

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckFrame(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  AttVal *local_28;
  AttVal *av;
  Bool HasTitle;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  (doc->access).numFrames = (doc->access).numFrames + 1;
  BVar2 = Level1_Enabled(doc);
  if (BVar2 != no) {
    for (local_28 = node->attributes; local_28 != (AttVal *)0x0; local_28 = local_28->next) {
      if (((local_28 == (AttVal *)0x0) || (local_28->dict == (Attribute *)0x0)) ||
         (local_28->dict->id != TidyAttr_LONGDESC)) {
        if (((local_28 == (AttVal *)0x0) || (local_28->dict == (Attribute *)0x0)) ||
           (local_28->dict->id != TidyAttr_SRC)) {
          if (((local_28 != (AttVal *)0x0) && (local_28->dict != (Attribute *)0x0)) &&
             (local_28->dict->id == TidyAttr_TITLE)) {
            BVar2 = hasValue(local_28);
            if (BVar2 != no) {
              bVar1 = true;
            }
            if (!bVar1) {
              if ((local_28->value == (tmbstr)0x0) ||
                 (uVar3 = prvTidytmbstrlen(local_28->value), uVar3 == 0)) {
                bVar1 = true;
                prvTidyReportAccessError(doc,node,0x300);
              }
              else {
                BVar2 = IsWhitespace(local_28->value);
                if ((BVar2 != no) && (uVar3 = prvTidytmbstrlen(local_28->value), uVar3 != 0)) {
                  bVar1 = true;
                  prvTidyReportAccessError(doc,node,0x301);
                }
              }
            }
          }
        }
        else {
          BVar2 = hasValue(local_28);
          if ((BVar2 != no) && (BVar2 = IsValidSrcExtension(local_28->value), BVar2 == no)) {
            prvTidyReportAccessError(doc,node,0x2d4);
          }
        }
      }
      else {
        BVar2 = hasValue(local_28);
        if ((BVar2 != no) && (uVar3 = prvTidytmbstrlen(local_28->value), 1 < uVar3)) {
          (doc->access).HasCheckedLongDesc = (doc->access).HasCheckedLongDesc + 1;
        }
      }
    }
    if (!bVar1) {
      prvTidyReportAccessError(doc,node,0x2ff);
    }
    if (((doc->access).numFrames == 3) && ((doc->access).HasCheckedLongDesc < 3)) {
      (doc->access).numFrames = 0;
      prvTidyReportAccessError(doc,node,0x2a6);
    }
  }
  return;
}

Assistant:

static void CheckFrame( TidyDocImpl* doc, Node* node )
{
    Bool HasTitle = no;
    AttVal* av;

    doc->access.numFrames++;

    if (Level1_Enabled( doc ))
    {
        /* Checks for attributes within the FRAME element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Checks if 'LONGDESC' value is valid only if present */
            if ( attrIsLONGDESC(av) )
            {
                if ( hasValue(av) && TY_(tmbstrlen)(av->value) > 1 )
                {
                    doc->access.HasCheckedLongDesc++;
                }
            }

            /* Checks for valid 'SRC' value within the frame element */
            else if ( attrIsSRC(av) )
            {
                if ( hasValue(av) && !IsValidSrcExtension(av->value) )
                {
                    TY_(ReportAccessError)( doc, node, FRAME_SRC_INVALID );
                }
            }

            /* Checks for valid 'TITLE' value within frame element */
            else if ( attrIsTITLE(av) )
            {
                if ( hasValue(av) )
                    HasTitle = yes;

                if ( !HasTitle )
                {
                    if ( av->value == NULL || TY_(tmbstrlen)(av->value) == 0 )
                    {
                        HasTitle = yes;
                        TY_(ReportAccessError)( doc, node, FRAME_TITLE_INVALID_NULL);
                    }
                    else
                    {
                        if ( IsWhitespace(av->value) && TY_(tmbstrlen)(av->value) > 0 )
                        {
                            HasTitle = yes;
                            TY_(ReportAccessError)( doc, node, FRAME_TITLE_INVALID_SPACES );
                        }
                    }
                }
            }
        }

        if ( !HasTitle )
        {
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_TITLE);
        }

        if ( doc->access.numFrames==3 && doc->access.HasCheckedLongDesc<3 )
        {
            doc->access.numFrames = 0;
            TY_(ReportAccessError)( doc, node, FRAME_MISSING_LONGDESC );
        }
    }
}